

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primepalindrome.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  size_type sVar2;
  ulong uVar3;
  ostream *this;
  double dVar4;
  __type _Var5;
  reference rVar6;
  __cxx11 local_b8 [32];
  reference local_98;
  int local_84;
  undefined1 auStack_80 [4];
  int i_1;
  _Bit_type local_78;
  int local_6c;
  undefined1 auStack_68 [4];
  int j;
  _Bit_type local_60;
  int local_58;
  int i;
  allocator<bool> local_42;
  bool local_41;
  undefined1 local_40 [8];
  vector<bool,_std::allocator<bool>_> primes;
  char **argv_local;
  int argc_local;
  
  local_41 = true;
  primes.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)argv;
  std::allocator<bool>::allocator(&local_42);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_40,1000,&local_41,&local_42);
  std::allocator<bool>::~allocator(&local_42);
  local_58 = 2;
  while( true ) {
    dVar4 = (double)local_58;
    sVar2 = std::vector<bool,_std::allocator<bool>_>::size
                      ((vector<bool,_std::allocator<bool>_> *)local_40);
    _Var5 = std::sqrt<unsigned_long>(sVar2);
    if (_Var5 <= dVar4) break;
    rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)local_40,(long)local_58);
    _auStack_68 = rVar6;
    bVar1 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)auStack_68);
    if (bVar1) {
      _Var5 = std::pow<int,int>(local_58,2);
      local_6c = (int)_Var5;
      while( true ) {
        uVar3 = (ulong)local_6c;
        sVar2 = std::vector<bool,_std::allocator<bool>_>::size
                          ((vector<bool,_std::allocator<bool>_> *)local_40);
        if (sVar2 <= uVar3) break;
        rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          ((vector<bool,_std::allocator<bool>_> *)local_40,(long)local_6c);
        _auStack_80 = rVar6;
        std::_Bit_reference::operator=((_Bit_reference *)auStack_80,false);
        local_6c = local_58 + local_6c;
      }
    }
    local_58 = local_58 + 1;
  }
  sVar2 = std::vector<bool,_std::allocator<bool>_>::size
                    ((vector<bool,_std::allocator<bool>_> *)local_40);
  local_84 = (int)sVar2;
  do {
    do {
      local_84 = local_84 + -1;
      if (local_84 < 2) goto LAB_0010260d;
      rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)local_40,(long)local_84);
      local_98 = rVar6;
      bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_98);
    } while (!bVar1);
    std::__cxx11::to_string(local_b8,local_84);
    bVar1 = isPalindrome((string *)local_b8);
    std::__cxx11::string::~string((string *)local_b8);
  } while (!bVar1);
  this = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_84);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
LAB_0010260d:
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)local_40)
  ;
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {

    vector<bool> primes(1000,true);

    for(int i = 2; i<sqrt(primes.size());i++){
        if(primes[i] == true){
            for(int j = pow(i,2); j < primes.size(); j+=i){
                primes[j] = false;
            }
        }
    }

    for(int i = primes.size()-1; i >= 2; i--){
        if(primes[i]){
            if(isPalindrome(to_string(i))) {
                std::cout << i << std::endl;
                break;
            }
        }
    };
    return 0;
}